

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::AssignOp::AssignOp(AssignOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  ValueRangeAccess valueRange_00;
  ValueEntryIterator<rsg::IsWritableEntry> first_00;
  ConstValueRangeAccess other;
  ValueRangeAccess valueRange_01;
  ConstValueRangeAccess valueRange_02;
  IsWritableIntersectingEntry filter;
  ConstValueRangeAccess valueRange_03;
  IsWritableIntersectingEntry filter_00;
  ValueRangeAccess dst;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableIntersectingEntry> first_01;
  ValueEntryIterator<rsg::IsWritableEntry> last;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableIntersectingEntry> last_00;
  GeneratorState *pGVar2;
  bool bVar3;
  VariableType *pVVar4;
  ShaderParameters *pSVar5;
  VariableManager *pVVar6;
  ValueEntry **ppVVar7;
  Random *pRVar8;
  ValueEntry *this_00;
  bool local_4f4;
  bool local_4f2;
  bool local_48b;
  bool local_48a;
  ConstValueRangeAccess local_438;
  ValueRangeAccess local_420;
  ValueEntry **local_408;
  ValueEntry **ppVStack_400;
  ValueEntry **local_3f8;
  VariableType *pVStack_3f0;
  Scalar *local_3e8;
  ValueEntry **local_3d8;
  ValueEntry **ppVStack_3d0;
  ValueEntry **local_3c8;
  VariableType *pVStack_3c0;
  Scalar *local_3b8;
  undefined1 local_3b0 [8];
  ConstValueRangeAccess selectedRange;
  ConstValueRangeAccess local_370;
  ConstValueRangeAccess local_358;
  undefined1 local_340 [8];
  Iterator i;
  undefined1 auStack_310 [6];
  bool supersetExists;
  bool possiblyCreateVar;
  Scalar *pSStack_308;
  Scalar *local_300;
  VariableType *local_2f8;
  Scalar *pSStack_2f0;
  Scalar *local_2e8;
  IsWritableIntersectingEntry local_2e0;
  undefined1 auStack_2c8 [8];
  Iterator end;
  undefined8 uStack_298;
  Scalar *local_290;
  IsWritableIntersectingEntry local_270;
  undefined1 auStack_258 [8];
  Iterator first;
  undefined8 uStack_228;
  Scalar *local_220;
  ConstValueRangeAccess local_218;
  ValueRange local_200;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  ValueEntry *local_140;
  ValueEntry *entry;
  Scalar *pSStack_130;
  Scalar *local_128;
  VariableType local_120;
  ValueRange local_d0;
  bool local_49;
  int local_48;
  bool useRandomRange;
  int maxScalars;
  VariableType *local_38;
  Scalar *pSStack_30;
  Scalar *local_28;
  GeneratorState *local_18;
  GeneratorState *state_local;
  AssignOp *this_local;
  
  local_18 = state;
  state_local = (GeneratorState *)this;
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_015ce350;
  local_28 = valueRange.m_max;
  local_38 = valueRange.m_type;
  pSStack_30 = valueRange.m_min;
  ValueRange::ValueRange(&this->m_valueRange,valueRange);
  ValueStorage<64>::ValueStorage(&this->m_value);
  this->m_lvalueExpr = (Expression *)0x0;
  this->m_rvalueExpr = (Expression *)0x0;
  pVVar4 = ValueRange::getType(&this->m_valueRange);
  bVar3 = VariableType::isVoid(pVVar4);
  if (bVar3) {
    pSVar5 = GeneratorState::getShaderParameters(local_18);
    iVar1 = pSVar5->maxCombinedVariableScalars;
    pVVar6 = GeneratorState::getVariableManager(local_18);
    local_48 = VariableManager::getNumAllocatedScalars(pVVar6);
    local_48 = iVar1 - local_48;
    pVVar6 = GeneratorState::getVariableManager(local_18);
    bVar3 = VariableManager::hasEntry<rsg::IsWritableEntry>(pVVar6);
    local_48a = true;
    if (bVar3) {
      local_48b = false;
      if (0 < local_48) {
        pRVar8 = GeneratorState::getRandom(local_18);
        local_48b = anon_unknown_0::getWeightedBool(pRVar8,0.1);
      }
      local_48a = local_48b;
    }
    local_49 = local_48a;
    if (local_48a == false) {
      pRVar8 = GeneratorState::getRandom(local_18);
      pVVar6 = GeneratorState::getVariableManager(local_18);
      VariableManager::getBegin<rsg::IsWritableEntry>(&local_158,pVVar6);
      pVVar6 = GeneratorState::getVariableManager(local_18);
      VariableManager::getEnd<rsg::IsWritableEntry>(&local_178,pVVar6);
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_end._M_current = (ValueEntry **)uStack_150;
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current = (ValueEntry **)local_158;
      first_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      ._16_8_ = local_148;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_end._M_current = (ValueEntry **)uStack_170;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current = (ValueEntry **)local_178;
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      ._16_8_ = local_168;
      local_140 = de::Random::
                  choose<rsg::ValueEntry_const*,rsg::ValueEntryIterator<rsg::IsWritableEntry>>
                            (pRVar8,first_00,last);
      ValueEntry::getValueRange(&local_218,local_140);
      other.m_min = local_218.m_min;
      other.m_type = local_218.m_type;
      other.m_max = local_218.m_max;
      ValueRange::ValueRange(&local_200,other);
      ValueRange::operator=(&this->m_valueRange,&local_200);
      ValueRange::~ValueRange(&local_200);
      pGVar2 = local_18;
      ValueRange::asAccess
                ((ValueRangeAccess *)
                 &first.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                  .m_filter.m_valueRange.m_max,&this->m_valueRange);
      valueRange_01.super_ConstValueRangeAccess.m_min = (Scalar *)uStack_228;
      valueRange_01.super_ConstValueRangeAccess.m_type =
           (VariableType *)
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_filter.m_valueRange.m_max;
      valueRange_01.super_ConstValueRangeAccess.m_max = local_220;
      anon_unknown_0::computeRandomValueRangeForInfElements(pGVar2,valueRange_01);
    }
    else {
      computeRandomType(&local_120,local_18,local_48);
      ValueRange::ValueRange(&local_d0,&local_120);
      ValueRange::operator=(&this->m_valueRange,&local_d0);
      ValueRange::~ValueRange(&local_d0);
      VariableType::~VariableType(&local_120);
      pGVar2 = local_18;
      ValueRange::asAccess((ValueRangeAccess *)&entry,&this->m_valueRange);
      valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_130;
      valueRange_00.super_ConstValueRangeAccess.m_type = (VariableType *)entry;
      valueRange_00.super_ConstValueRangeAccess.m_max = local_128;
      computeRandomValueRange(pGVar2,valueRange_00);
    }
  }
  pVVar6 = GeneratorState::getVariableManager(local_18);
  ValueRange::asAccess
            ((ValueRangeAccess *)
             &end.
              super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
              .m_filter.m_valueRange.m_max,&this->m_valueRange);
  valueRange_02.m_min = (Scalar *)uStack_298;
  valueRange_02.m_type =
       (VariableType *)
       end.
       super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
       .m_filter.m_valueRange.m_max;
  valueRange_02.m_max = local_290;
  anon_unknown_0::IsWritableIntersectingEntry::IsWritableIntersectingEntry(&local_270,valueRange_02)
  ;
  filter.m_valueRange.m_min = local_270.m_valueRange.m_min;
  filter.m_valueRange.m_type = local_270.m_valueRange.m_type;
  filter.m_valueRange.m_max = local_270.m_valueRange.m_max;
  VariableManager::getBegin<rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
            ((ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableIntersectingEntry> *)
             auStack_258,pVVar6,filter);
  pVVar6 = GeneratorState::getVariableManager(local_18);
  ValueRange::asAccess((ValueRangeAccess *)auStack_310,&this->m_valueRange);
  local_2e8 = local_300;
  local_2f8 = _auStack_310;
  pSStack_2f0 = pSStack_308;
  valueRange_03.m_min = pSStack_308;
  valueRange_03.m_type = _auStack_310;
  valueRange_03.m_max = local_300;
  anon_unknown_0::IsWritableIntersectingEntry::IsWritableIntersectingEntry(&local_2e0,valueRange_03)
  ;
  filter_00.m_valueRange.m_min = local_2e0.m_valueRange.m_min;
  filter_00.m_valueRange.m_type = local_2e0.m_valueRange.m_type;
  filter_00.m_valueRange.m_max = local_2e0.m_valueRange.m_max;
  VariableManager::getEnd<rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
            ((ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableIntersectingEntry> *)
             auStack_2c8,pVVar6,filter_00);
  pGVar2 = local_18;
  pVVar4 = ValueRange::getType(&this->m_valueRange);
  bVar3 = anon_unknown_0::canAllocateVariable(pGVar2,pVVar4);
  local_4f2 = false;
  if (bVar3) {
    bVar3 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
            ::operator==((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                          *)auStack_258,
                         (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                          *)auStack_2c8);
    local_4f4 = true;
    if (!bVar3) {
      pRVar8 = GeneratorState::getRandom(local_18);
      local_4f4 = anon_unknown_0::getWeightedBool(pRVar8,0.5);
    }
    local_4f2 = local_4f4;
  }
  i.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
  .m_filter.m_valueRange.m_max._7_1_ = local_4f2;
  if (local_4f2 == false) {
    i.
    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
    .m_filter.m_valueRange.m_max._6_1_ = 0;
    memcpy(local_340,auStack_258,0x28);
    while (bVar3 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                   ::operator!=((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                                 *)local_340,
                                (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                                 *)auStack_2c8), bVar3) {
      ppVVar7 = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                ::operator*((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                             *)local_340);
      ValueEntry::getValueRange(&local_358,*ppVVar7);
      ValueRange::asAccess((ValueRangeAccess *)&local_370,&this->m_valueRange);
      bVar3 = ConstValueRangeAccess::isSupersetOf(&local_358,&local_370);
      if (bVar3) {
        i.
        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
        .m_filter.m_valueRange.m_max._6_1_ = 1;
        break;
      }
      FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      ::operator++((FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                    *)&selectedRange.m_max,
                   (FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                    *)local_340,0);
    }
    if ((i.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
         .m_filter.m_valueRange.m_max._6_1_ & 1) == 0) {
      pRVar8 = GeneratorState::getRandom(local_18);
      local_3b8 = first.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                  .m_filter.m_valueRange.m_min;
      local_3c8 = first.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                  .m_end._M_current;
      pVStack_3c0 = first.
                    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                    .m_filter.m_valueRange.m_type;
      local_3d8 = (ValueEntry **)auStack_258;
      ppVStack_3d0 = first.
                     super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                     .m_iter._M_current;
      local_3e8 = end.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                  .m_filter.m_valueRange.m_min;
      local_3f8 = end.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                  .m_end._M_current;
      pVStack_3f0 = end.
                    super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                    .m_filter.m_valueRange.m_type;
      local_408 = (ValueEntry **)auStack_2c8;
      ppVStack_400 = end.
                     super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
                     .m_iter._M_current;
      first_01.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_end._M_current =
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_iter._M_current;
      first_01.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_iter._M_current = (ValueEntry **)auStack_258;
      first_01.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_filter.m_valueRange.m_type =
           (VariableType *)
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_end._M_current;
      first_01.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_filter.m_valueRange.m_min =
           (Scalar *)
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_filter.m_valueRange.m_type;
      first_01.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_filter.m_valueRange.m_max =
           first.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_filter.m_valueRange.m_min;
      last_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_end._M_current =
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_iter._M_current;
      last_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_iter._M_current = (ValueEntry **)auStack_2c8;
      last_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_filter.m_valueRange.m_type =
           (VariableType *)
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_end._M_current;
      last_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_filter.m_valueRange.m_min =
           (Scalar *)
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_filter.m_valueRange.m_type;
      last_00.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
      .m_filter.m_valueRange.m_max =
           end.
           super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsWritableIntersectingEntry>
           .m_filter.m_valueRange.m_min;
      this_00 = de::Random::
                choose<rsg::ValueEntry_const*,rsg::ValueEntryIterator<rsg::(anonymous_namespace)::IsWritableIntersectingEntry>>
                          (pRVar8,first_01,last_00);
      ValueEntry::getValueRange((ConstValueRangeAccess *)local_3b0,this_00);
      ValueRange::asAccess(&local_420,&this->m_valueRange);
      ValueRange::asAccess((ValueRangeAccess *)&local_438,&this->m_valueRange);
      dst.super_ConstValueRangeAccess.m_min = local_420.super_ConstValueRangeAccess.m_min;
      dst.super_ConstValueRangeAccess.m_type = local_420.super_ConstValueRangeAccess.m_type;
      dst.super_ConstValueRangeAccess.m_max = local_420.super_ConstValueRangeAccess.m_max;
      ValueRange::computeIntersection(dst,&local_438,(ConstValueRangeAccess *)local_3b0);
    }
  }
  return;
}

Assistant:

AssignOp::AssignOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_valueRange	(valueRange)
	, m_lvalueExpr	(DE_NULL)
	, m_rvalueExpr	(DE_NULL)
{
	if (m_valueRange.getType().isVoid())
	{
		// Compute random value range
		int		maxScalars		= state.getShaderParameters().maxCombinedVariableScalars - state.getVariableManager().getNumAllocatedScalars();
		bool	useRandomRange	= !state.getVariableManager().hasEntry<IsWritableEntry>() || ((maxScalars > 0) && getWeightedBool(state.getRandom(), 0.1f));

		if (useRandomRange)
		{
			DE_ASSERT(maxScalars > 0);
			m_valueRange = ValueRange(computeRandomType(state, maxScalars));
			computeRandomValueRange(state, m_valueRange.asAccess());
		}
		else
		{
			// Use value range from random entry
			// \todo [2011-02-28 pyry] Give lower weight to entries without range? Choose subtype range?
			const ValueEntry* entry = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin<IsWritableEntry>(), state.getVariableManager().getEnd<IsWritableEntry>());
			m_valueRange = ValueRange(entry->getValueRange());

			computeRandomValueRangeForInfElements(state, m_valueRange.asAccess());

			DE_ASSERT(state.getVariableManager().hasEntry(IsWritableIntersectingEntry(m_valueRange.asAccess())));
		}
	}

	IsWritableIntersectingEntry::Iterator first	= state.getVariableManager().getBegin(IsWritableIntersectingEntry(m_valueRange.asAccess()));
	IsWritableIntersectingEntry::Iterator end	= state.getVariableManager().getEnd(IsWritableIntersectingEntry(m_valueRange.asAccess()));

	bool possiblyCreateVar = canAllocateVariable(state, m_valueRange.getType()) &&
							 (first == end || getWeightedBool(state.getRandom(), 0.5f));

	if (!possiblyCreateVar)
	{
		// Find all possible valueranges matching given type and intersecting with valuerange
		// \todo [pyry] Actually collect all ValueRanges, currently operates only on whole variables
		DE_ASSERT(first != end);

		// Try to select one closest to given range but bigger (eg. superset)
		bool supersetExists = false;
		for (IsWritableIntersectingEntry::Iterator i = first; i != end; i++)
		{
			if ((*i)->getValueRange().isSupersetOf(m_valueRange.asAccess()))
			{
				supersetExists = true;
				break;
			}
		}

		if (!supersetExists)
		{
			// Select some other range and compute intersection
			// \todo [2011-02-03 pyry] Use some heuristics to select the range?
			ConstValueRangeAccess selectedRange = state.getRandom().choose<const ValueEntry*>(first, end)->getValueRange();

			ValueRange::computeIntersection(m_valueRange.asAccess(), m_valueRange.asAccess(), selectedRange);
		}
	}
}